

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

void ZSTD_safecopy(BYTE *op,BYTE *oend_w,BYTE *ip,ptrdiff_t length,ZSTD_overlap_e ovtype)

{
  BYTE *pBVar1;
  BYTE BVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  BYTE *pBVar6;
  ulong uVar7;
  long lVar8;
  
  pBVar1 = op + length;
  if (length < 8) {
    if (0 < length) {
      do {
        BVar2 = *ip;
        ip = ip + 1;
        *op = BVar2;
        op = op + 1;
      } while (op < pBVar1);
    }
  }
  else {
    if (ovtype == ZSTD_overlap_src_before_dst) {
      uVar7 = (long)op - (long)ip;
      if (uVar7 < 8) {
        iVar3 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar7 * 4);
        *op = *ip;
        op[1] = ip[1];
        op[2] = ip[2];
        op[3] = ip[3];
        pBVar6 = ip + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar7 * 4);
        ip = ip + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar7 * 4) - (long)iVar3);
        *(undefined4 *)(op + 4) = *(undefined4 *)pBVar6;
      }
      else {
        *(undefined8 *)op = *(undefined8 *)ip;
      }
      ip = ip + 8;
      op = op + 8;
    }
    if (oend_w < pBVar1) {
      if (op <= oend_w) {
        lVar5 = (long)oend_w - (long)op;
        if ((ovtype == ZSTD_overlap_src_before_dst) && (pBVar6 = ip, (long)op - (long)ip < 0x10)) {
          do {
            *(undefined8 *)op = *(undefined8 *)pBVar6;
            op = op + 8;
            pBVar6 = pBVar6 + 8;
          } while (op < oend_w);
        }
        else {
          uVar4 = *(undefined8 *)(ip + 8);
          *(undefined8 *)op = *(undefined8 *)ip;
          *(undefined8 *)(op + 8) = uVar4;
          if (0x10 < lVar5) {
            lVar8 = 0x10;
            do {
              uVar4 = *(undefined8 *)(ip + lVar8 + 8);
              pBVar6 = op + lVar8;
              *(undefined8 *)pBVar6 = *(undefined8 *)(ip + lVar8);
              *(undefined8 *)(pBVar6 + 8) = uVar4;
              uVar4 = *(undefined8 *)(ip + lVar8 + 0x10 + 8);
              *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)(ip + lVar8 + 0x10);
              *(undefined8 *)(pBVar6 + 0x18) = uVar4;
              lVar8 = lVar8 + 0x20;
            } while (pBVar6 + 0x20 < oend_w);
          }
        }
        ip = ip + lVar5;
        op = oend_w;
      }
      for (; op < pBVar1; op = op + 1) {
        BVar2 = *ip;
        ip = ip + 1;
        *op = BVar2;
      }
    }
    else {
      pBVar1 = op + length;
      if ((ovtype == ZSTD_overlap_src_before_dst) && ((long)op - (long)ip < 0x10)) {
        do {
          *(undefined8 *)op = *(undefined8 *)ip;
          op = op + 8;
          ip = ip + 8;
        } while (op < pBVar1);
      }
      else {
        uVar4 = *(undefined8 *)(ip + 8);
        *(undefined8 *)op = *(undefined8 *)ip;
        *(undefined8 *)(op + 8) = uVar4;
        if (0x10 < (ulong)length) {
          lVar5 = 0x10;
          do {
            uVar4 = *(undefined8 *)(ip + lVar5 + 8);
            pBVar6 = op + lVar5;
            *(undefined8 *)pBVar6 = *(undefined8 *)(ip + lVar5);
            *(undefined8 *)(pBVar6 + 8) = uVar4;
            uVar4 = *(undefined8 *)(ip + lVar5 + 0x10 + 8);
            *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)(ip + lVar5 + 0x10);
            *(undefined8 *)(pBVar6 + 0x18) = uVar4;
            lVar5 = lVar5 + 0x20;
          } while (pBVar6 + 0x20 < pBVar1);
        }
      }
    }
  }
  return;
}

Assistant:

static void ZSTD_safecopy(BYTE* op, BYTE* const oend_w, BYTE const* ip, ptrdiff_t length, ZSTD_overlap_e ovtype) {
    ptrdiff_t const diff = op - ip;
    BYTE* const oend = op + length;

    assert((ovtype == ZSTD_no_overlap && (diff <= -8 || diff >= 8 || op >= oend_w)) ||
           (ovtype == ZSTD_overlap_src_before_dst && diff >= 0));

    if (length < 8) {
        /* Handle short lengths. */
        while (op < oend) *op++ = *ip++;
        return;
    }
    if (ovtype == ZSTD_overlap_src_before_dst) {
        /* Copy 8 bytes and ensure the offset >= 8 when there can be overlap. */
        assert(length >= 8);
        ZSTD_overlapCopy8(&op, &ip, diff);
        assert(op - ip >= 8);
        assert(op <= oend);
    }

    if (oend <= oend_w) {
        /* No risk of overwrite. */
        ZSTD_wildcopy(op, ip, length, ovtype);
        return;
    }
    if (op <= oend_w) {
        /* Wildcopy until we get close to the end. */
        assert(oend > oend_w);
        ZSTD_wildcopy(op, ip, oend_w - op, ovtype);
        ip += oend_w - op;
        op = oend_w;
    }
    /* Handle the leftovers. */
    while (op < oend) *op++ = *ip++;
}